

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnionDatatypeValidator.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::UnionDatatypeValidator::UnionDatatypeValidator
          (UnionDatatypeValidator *this,
          RefVectorOf<xercesc_4_0::DatatypeValidator> *memberTypeValidators,int finalSet,
          MemoryManager *manager)

{
  InvalidDatatypeFacetException *this_00;
  MemoryManager *manager_local;
  int finalSet_local;
  RefVectorOf<xercesc_4_0::DatatypeValidator> *memberTypeValidators_local;
  UnionDatatypeValidator *this_local;
  
  DatatypeValidator::DatatypeValidator
            (&this->super_DatatypeValidator,(DatatypeValidator *)0x0,
             (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0,finalSet,
             Union,manager);
  (this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable =
       (_func_int **)&PTR__UnionDatatypeValidator_005357a8;
  this->fEnumerationInherited = false;
  this->fMemberTypesInherited = false;
  this->fEnumeration = (RefArrayVectorOf<char16_t> *)0x0;
  this->fMemberTypeValidators = (RefVectorOf<xercesc_4_0::DatatypeValidator> *)0x0;
  if (memberTypeValidators == (RefVectorOf<xercesc_4_0::DatatypeValidator> *)0x0) {
    this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
    InvalidDatatypeFacetException::InvalidDatatypeFacetException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/UnionDatatypeValidator.cpp"
               ,0x42,FACET_Union_Null_memberTypeValidators,manager);
    __cxa_throw(this_00,&InvalidDatatypeFacetException::typeinfo,
                InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
  }
  this->fMemberTypeValidators = memberTypeValidators;
  return;
}

Assistant:

UnionDatatypeValidator::UnionDatatypeValidator(
                        RefVectorOf<DatatypeValidator>* const memberTypeValidators
                      , const int                             finalSet
                      , MemoryManager* const                  manager)
:DatatypeValidator(0, 0, finalSet, DatatypeValidator::Union, manager)
,fEnumerationInherited(false)
,fMemberTypesInherited(false)
,fEnumeration(0)
,fMemberTypeValidators(0)
{
    if ( !memberTypeValidators )
    {
        ThrowXMLwithMemMgr(InvalidDatatypeFacetException
               , XMLExcepts::FACET_Union_Null_memberTypeValidators, manager);
    }

    // no pattern, no enumeration
    fMemberTypeValidators = memberTypeValidators;
}